

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

void __thiscall net_tests::cnetaddr_serialize_v1::test_method(cnetaddr_serialize_v1 *this)

{
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  bool bVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  const_string file_01;
  Span<const_unsigned_char> s_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<const_unsigned_char> s_02;
  const_string file_05;
  Span<const_unsigned_char> s_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar5;
  undefined8 in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  _Manager_type in_stack_fffffffffffffd88;
  _Invoker_type in_stack_fffffffffffffd90;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  _Any_data local_1c0;
  code *local_1b0;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  _Any_data local_180;
  code *local_170;
  assertion_result local_160;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  SerParams ser_params;
  DataStream local_118;
  char *local_f8;
  string *local_f0;
  char *local_e8;
  char *local_e0;
  assertion_result local_d8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  bool local_a0;
  string local_98;
  CNetAddr addr;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&addr);
  local_c0._8_8_ = &local_118;
  local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.m_read_pos = 0;
  local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0._0_8_ = &ser_params;
  ser_params.super_SerParams.enc = V1;
  ser_params.fmt = Network;
  CNetAddr::Serialize<ParamsStream<DataStream&,CAddress::SerParams>>
            (&addr,(ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x150;
  file.m_begin = (iterator)&local_130;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_140,msg);
  local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
  local_160._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  s.m_data = local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_118.m_read_pos;
  s.m_size = (long)local_118.vch.
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)s.m_data;
  HexStr_abi_cxx11_(&local_98,s);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"00000000000000000000000000000000");
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_e0 = "";
  local_b0._8_8_ = &local_f0;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_f8;
  local_f8 = "00000000000000000000000000000000";
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d55c0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_f0 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)&local_160,1,2,REQUIRE,0xede7b6,(size_t)&local_e8,0x150,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0,
             "\"00000000000000000000000000000000\"",local_58);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_118.m_read_pos = 0;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"1.2.3.4","");
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_180,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd80;
  dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_fffffffffffffd78;
  dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffffd88;
  dns_lookup_function._M_invoker = in_stack_fffffffffffffd90;
  LookupHost((optional<CNetAddr> *)local_c0,(string *)local_58,false,dns_lookup_function);
  if (local_a0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    if (0x10 < addr.m_addr._size) {
      free(addr.m_addr._union.indirect_contents.indirect);
    }
    addr.m_addr._union.indirect_contents.indirect = (char *)local_c0._0_8_;
    addr.m_addr._union.indirect_contents.capacity = local_c0._8_4_;
    addr.m_addr._union._12_4_ = local_c0._12_4_;
    addr.m_addr._size = local_b0._M_allocated_capacity._0_4_;
    local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffff00000000;
    addr.m_net = local_b0._8_4_;
    addr.m_scope_id = local_b0._12_4_;
    if (local_a0 == true) {
      local_a0 = false;
    }
    if (local_170 != (code *)0x0) {
      (*local_170)(&local_180,&local_180,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
    }
    local_c0._0_8_ = &ser_params;
    local_c0._8_8_ = &local_118;
    CNetAddr::Serialize<ParamsStream<DataStream&,CAddress::SerParams>>
              (&addr,(ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0);
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_188 = "";
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x155;
    file_00.m_begin = (iterator)&local_190;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
               msg_00);
    local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
    local_160._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_148 = "";
    s_00.m_data = local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_118.m_read_pos;
    s_00.m_size = (long)local_118.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)s_00.m_data;
    HexStr_abi_cxx11_(&local_98,s_00);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_98,"00000000000000000000ffff01020304");
    local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar2 == 0);
    local_d8.m_message.px = (element_type *)0x0;
    local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_e0 = "";
    local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
    local_c0._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_b0._8_8_ = &local_f0;
    local_f8 = "00000000000000000000ffff01020304";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_013d55c0;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = &local_f8;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_f0 = &local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,(lazy_ostream *)&local_160,1,2,REQUIRE,0xede7b6,(size_t)&local_e8,0x155,
               (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0,
               "\"00000000000000000000ffff01020304\"",(string *)local_58);
    boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    local_118.m_read_pos = 0;
    local_58._0_8_ = &local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"1a1b:2a2b:3a3b:4a4b:5a5b:6a6b:7a7b:8a8b","");
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_1c0,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd80;
    dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffffd78;
    dns_lookup_function_00.super__Function_base._M_manager = in_stack_fffffffffffffd88;
    dns_lookup_function_00._M_invoker = in_stack_fffffffffffffd90;
    LookupHost((optional<CNetAddr> *)local_c0,(string *)local_58,false,dns_lookup_function_00);
    if (local_a0 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      if (0x10 < addr.m_addr._size) {
        free(addr.m_addr._union.indirect_contents.indirect);
      }
      addr.m_addr._union.indirect_contents.indirect = (char *)local_c0._0_8_;
      addr.m_addr._union.indirect_contents.capacity = local_c0._8_4_;
      addr.m_addr._union._12_4_ = local_c0._12_4_;
      addr.m_addr._size = local_b0._M_allocated_capacity._0_4_;
      local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffff00000000;
      addr.m_net = local_b0._8_4_;
      addr.m_scope_id = local_b0._12_4_;
      if (local_a0 == true) {
        local_a0 = false;
      }
      if (local_1b0 != (code *)0x0) {
        (*local_1b0)(&local_1c0,&local_1c0,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
      }
      local_c0._0_8_ = &ser_params;
      local_c0._8_8_ = &local_118;
      CNetAddr::Serialize<ParamsStream<DataStream&,CAddress::SerParams>>
                (&addr,(ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0);
      local_1d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_1c8 = "";
      local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x15a;
      file_01.m_begin = (iterator)&local_1d0;
      msg_01.m_end = pvVar4;
      msg_01.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
                 msg_01);
      local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
      local_160._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_148 = "";
      s_01.m_data = local_118.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start + local_118.m_read_pos;
      s_01.m_size = (long)local_118.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)s_01.m_data;
      HexStr_abi_cxx11_(&local_98,s_01);
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_98,"1a1b2a2b3a3b4a4b5a5b6a6b7a7b8a8b");
      local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
      local_d8.m_message.px = (element_type *)0x0;
      local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_e0 = "";
      local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &PTR__lazy_ostream_013d3d70;
      local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_b0._8_8_ = &local_f0;
      local_f8 = "1a1b2a2b3a3b4a4b5a5b6a6b7a7b8a8b";
      local_58[8] = false;
      local_58._0_8_ = &PTR__lazy_ostream_013d55c0;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = &local_f8;
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x2;
      local_f0 = &local_98;
      boost::test_tools::tt_detail::report_assertion
                (&local_d8,(lazy_ostream *)&local_160,1,2,REQUIRE,0xede7b6,(size_t)&local_e8,0x15a,
                 (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0,
                 "\"1a1b2a2b3a3b4a4b5a5b6a6b7a7b8a8b\"",(string *)local_58);
      boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      local_118.m_read_pos = 0;
      local_1f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_1e8 = "";
      local_200 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x15e;
      file_02.m_begin = (iterator)&local_1f0;
      msg_02.m_end = pvVar4;
      msg_02.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_200,
                 msg_02);
      local_c0._0_8_ = &local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"6hzph5hv6337r6p2.onion","");
      _cVar5 = 0x4bb35c;
      bVar1 = CNetAddr::SetSpecial(&addr,(string *)local_c0);
      local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)!bVar1;
      local_160.m_message.px = (element_type *)0x0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_98._M_dataplus._M_p = "!addr.SetSpecial(\"6hzph5hv6337r6p2.onion\")";
      local_98._M_string_length = 0xedddb8;
      local_58[8] = false;
      local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_210 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_208 = "";
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x0;
      local_48._8_8_ = &local_98;
      boost::test_tools::tt_detail::report_assertion
                (&local_160,(lazy_ostream *)local_58,1,0,WARN,_cVar5,(size_t)&local_210,0x15e);
      boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._0_8_ != &local_b0) {
        operator_delete((void *)local_c0._0_8_,(ulong)(local_b0._M_allocated_capacity + 1));
      }
      local_220 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_218 = "";
      local_230 = &boost::unit_test::basic_cstring<char_const>::null;
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x160;
      file_03.m_begin = (iterator)&local_220;
      msg_03.m_end = pvVar4;
      msg_03.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_230,
                 msg_03);
      local_c0._0_8_ = &local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"
                 ,"");
      _cVar5 = 0x4bb471;
      bVar1 = CNetAddr::SetSpecial(&addr,(string *)local_c0);
      local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar1;
      local_160.m_message.px = (element_type *)0x0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_98._M_dataplus._M_p =
           "addr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\")";
      local_98._M_string_length = 0xeab7fc;
      local_58[8] = false;
      local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_240 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_238 = "";
      pvVar3 = (iterator)0x2;
      pvVar4 = (iterator)0x0;
      local_48._8_8_ = &local_98;
      boost::test_tools::tt_detail::report_assertion
                (&local_160,(lazy_ostream *)local_58,2,0,WARN,_cVar5,(size_t)&local_240,0x160);
      boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._0_8_ != &local_b0) {
        operator_delete((void *)local_c0._0_8_,(ulong)(local_b0._M_allocated_capacity + 1));
      }
      local_c0._0_8_ = &ser_params;
      local_c0._8_8_ = &local_118;
      CNetAddr::Serialize<ParamsStream<DataStream&,CAddress::SerParams>>
                (&addr,(ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0);
      local_250 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_248 = "";
      local_260 = &boost::unit_test::basic_cstring<char_const>::null;
      local_258 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x162;
      file_04.m_begin = (iterator)&local_250;
      msg_04.m_end = pvVar4;
      msg_04.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_260,
                 msg_04);
      local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
      local_160._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_148 = "";
      s_02.m_data = local_118.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start + local_118.m_read_pos;
      s_02.m_size = (long)local_118.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)s_02.m_data;
      HexStr_abi_cxx11_(&local_98,s_02);
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_98,"00000000000000000000000000000000");
      local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
      local_d8.m_message.px = (element_type *)0x0;
      local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_e0 = "";
      local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &PTR__lazy_ostream_013d3d70;
      local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_b0._8_8_ = &local_f0;
      local_f8 = "00000000000000000000000000000000";
      local_58[8] = false;
      local_58._0_8_ = &PTR__lazy_ostream_013d55c0;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = &local_f8;
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x2;
      local_f0 = &local_98;
      boost::test_tools::tt_detail::report_assertion
                (&local_d8,(lazy_ostream *)&local_160,1,2,REQUIRE,0xede7b6,(size_t)&local_e8,0x162,
                 (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0,
                 "\"00000000000000000000000000000000\"",(lazy_ostream *)local_58);
      boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      local_118.m_read_pos = 0;
      local_c0._0_8_ = &local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"a","");
      CNetAddr::SetInternal(&addr,(string *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._0_8_ != &local_b0) {
        operator_delete((void *)local_c0._0_8_,(ulong)(local_b0._M_allocated_capacity + 1));
      }
      local_c0._0_8_ = &ser_params;
      local_c0._8_8_ = &local_118;
      CNetAddr::Serialize<ParamsStream<DataStream&,CAddress::SerParams>>
                (&addr,(ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0);
      file_05.m_end = (iterator)0x167;
      file_05.m_begin = &stack0xfffffffffffffd90;
      msg_05.m_end = pvVar4;
      msg_05.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                 (size_t)&stack0xfffffffffffffd80,msg_05);
      local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
      local_160._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_148 = "";
      s_03.m_data = local_118.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start + local_118.m_read_pos;
      s_03.m_size = (long)local_118.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)s_03.m_data;
      HexStr_abi_cxx11_(&local_98,s_03);
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_98,"fd6b88c08724ca978112ca1bbdcafac2");
      local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
      local_d8.m_message.px = (element_type *)0x0;
      local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_e0 = "";
      local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &PTR__lazy_ostream_013d3d70;
      local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_b0._8_8_ = &local_f0;
      local_f8 = "fd6b88c08724ca978112ca1bbdcafac2";
      local_58[8] = false;
      local_58._0_8_ = &PTR__lazy_ostream_013d55c0;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = &local_f8;
      local_f0 = &local_98;
      boost::test_tools::tt_detail::report_assertion
                (&local_d8,(lazy_ostream *)&local_160,1,2,REQUIRE,0xede7b6,(size_t)&local_e8,0x167,
                 (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c0,
                 "\"fd6b88c08724ca978112ca1bbdcafac2\"",(lazy_ostream *)local_58);
      boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      local_118.m_read_pos = 0;
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_118);
      if (0x10 < addr.m_addr._size) {
        free(addr.m_addr._union.indirect_contents.indirect);
        addr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_serialize_v1)
{
    CNetAddr addr;
    DataStream s{};
    const auto ser_params{CAddress::V1_NETWORK};

    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000000000000000");
    s.clear();

    addr = LookupHost("1.2.3.4", false).value();
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000ffff01020304");
    s.clear();

    addr = LookupHost("1a1b:2a2b:3a3b:4a4b:5a5b:6a6b:7a7b:8a8b", false).value();
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "1a1b2a2b3a3b4a4b5a5b6a6b7a7b8a8b");
    s.clear();

    // TORv2, no longer supported
    BOOST_CHECK(!addr.SetSpecial("6hzph5hv6337r6p2.onion"));

    BOOST_REQUIRE(addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"));
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000000000000000");
    s.clear();

    addr.SetInternal("a");
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "fd6b88c08724ca978112ca1bbdcafac2");
    s.clear();
}